

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitFactor.c
# Opt level: O0

void Kit_FactorTest(uint *pTruth,int nVars)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  Vec_Int_t *vMemory_00;
  Vec_Int_t *vMemory_01;
  Kit_Graph_t *pGraph_00;
  int RetValue;
  Kit_Graph_t *pGraph;
  Vec_Int_t *vMemory;
  Vec_Int_t *vCover;
  int nVars_local;
  uint *pTruth_local;
  
  vMemory_00 = Vec_IntAlloc(0);
  iVar1 = Kit_TruthIsop(pTruth,nVars,vMemory_00,0);
  if (iVar1 == 0) {
    vMemory_01 = Vec_IntAlloc(0);
    pGraph_00 = Kit_SopFactor(vMemory_00,0,nVars,vMemory_01);
    uVar2 = Vec_IntSize(vMemory_00);
    uVar3 = Kit_GraphNodeNum(pGraph_00);
    uVar4 = Vec_IntSize(vMemory_01);
    printf("Vars = %2d. Cubes = %3d. FFNodes = %3d. FF_memory = %3d.\n",(ulong)(uint)nVars,
           (ulong)uVar2,(ulong)uVar3,(ulong)uVar4);
    Vec_IntFree(vMemory_01);
    Vec_IntFree(vMemory_00);
    Kit_GraphFree(pGraph_00);
    return;
  }
  __assert_fail("RetValue == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/kit/kitFactor.c"
                ,0x13e,"void Kit_FactorTest(unsigned int *, int)");
}

Assistant:

void Kit_FactorTest( unsigned * pTruth, int nVars )
{
    Vec_Int_t * vCover, * vMemory;
    Kit_Graph_t * pGraph;
//    unsigned uTruthRes;
    int RetValue;

    // derive SOP
    vCover = Vec_IntAlloc( 0 );
    RetValue = Kit_TruthIsop( pTruth, nVars, vCover, 0 );
    assert( RetValue == 0 );

    // derive factored form
    vMemory = Vec_IntAlloc( 0 );
    pGraph = Kit_SopFactor( vCover, 0, nVars, vMemory );
/*
    // derive truth table
    assert( nVars <= 5 );
    uTruthRes = Kit_GraphToTruth( pGraph );
    if ( uTruthRes != pTruth[0] )
        printf( "Verification failed!" );
*/
    printf( "Vars = %2d. Cubes = %3d. FFNodes = %3d. FF_memory = %3d.\n",
        nVars, Vec_IntSize(vCover), Kit_GraphNodeNum(pGraph), Vec_IntSize(vMemory) );

    Vec_IntFree( vMemory );
    Vec_IntFree( vCover );
    Kit_GraphFree( pGraph );
}